

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.hpp
# Opt level: O1

string * JSONFieldName(string *__return_storage_ptr__,string *name)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  sVar1 = name->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] != '_') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JSONFieldName(const std::string &name) {
    bool nextUppercase = false;
    std::string result = "";
    for (auto itr : name) {
        if (itr == '_') {
            nextUppercase = true;
        } else {
            char c = itr;
            if (nextUppercase) {
                if ('a' <= c and c <= 'z') {
                    c += 'A' - 'a';
                }
            }

            result += c;
            nextUppercase = false;
        }
    }
    return result;
}